

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall kratos::IRVisitor::visit_content(IRVisitor *this,Generator *generator)

{
  bool bVar1;
  element_type *peVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  *pmVar3;
  pair<std::__detail::_Node_iterator<kratos::IRNode_*,_true,_false>,_bool> pVar4;
  _Node_iterator_base<kratos::IRNode_*,_false> local_148;
  element_type *local_140;
  _Node_iterator_base<kratos::IRNode_*,_false> local_138;
  element_type *local_130;
  element_type *ptr_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>
  *iter;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  *__range1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  functions;
  _Node_iterator_base<kratos::IRNode_*,_false> local_c8;
  element_type *local_c0;
  _Node_iterator_base<kratos::IRNode_*,_false> local_b8;
  element_type *local_b0;
  element_type *ptr;
  undefined1 local_98 [8];
  shared_ptr<kratos::Var> var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  _Node_iterator_base<kratos::IRNode_*,_false> local_40;
  _Node_iterator_base<kratos::IRNode_*,_false> local_38;
  element_type *local_30;
  IRNode *child;
  uint64_t i;
  uint64_t stmts_count;
  Generator *generator_local;
  IRVisitor *this_local;
  
  stmts_count = (uint64_t)generator;
  generator_local = (Generator *)this;
  Generator::accept_generator(generator,this);
  this->level = this->level + 1;
  i = Generator::stmts_count((Generator *)stmts_count);
  for (child = (IRNode *)0x0; child < i; child = (IRNode *)((long)&child->_vptr_IRNode + 1)) {
    local_30 = (element_type *)(**(code **)(*(long *)stmts_count + 0x10))(stmts_count,child);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::IRNode_*,_std::hash<kratos::IRNode_*>,_std::equal_to<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
         ::find(&this->visited_,(key_type *)&local_30);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::IRNode_*,_std::hash<kratos::IRNode_*>,_std::equal_to<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
         ::end(&this->visited_);
    bVar1 = std::__detail::operator==(&local_38,&local_40);
    if (bVar1) {
      pVar4 = std::
              unordered_set<kratos::IRNode*,std::hash<kratos::IRNode*>,std::equal_to<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
              ::emplace<kratos::IRNode*&>
                        ((unordered_set<kratos::IRNode*,std::hash<kratos::IRNode*>,std::equal_to<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
                          *)&this->visited_,(IRNode **)&local_30);
      var_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar4.first.super__Node_iterator_base<kratos::IRNode_*,_false>._M_cur;
      (**this->_vptr_IRVisitor)(this,local_30);
    }
  }
  Generator::get_all_var_names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(Generator *)stmts_count);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&name), bVar1) {
    var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    Generator::get_var((Generator *)local_98,(string *)stmts_count);
    local_c0 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_98);
    local_b0 = local_c0;
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::IRNode_*,_std::hash<kratos::IRNode_*>,_std::equal_to<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
         ::find(&this->visited_,(key_type *)&local_c0);
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::IRNode_*,_std::hash<kratos::IRNode_*>,_std::equal_to<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
         ::end(&this->visited_);
    bVar1 = std::__detail::operator==(&local_b8,&local_c8);
    if (bVar1) {
      pVar4 = std::
              unordered_set<kratos::IRNode*,std::hash<kratos::IRNode*>,std::equal_to<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
              ::emplace<kratos::Var*&>
                        ((unordered_set<kratos::IRNode*,std::hash<kratos::IRNode*>,std::equal_to<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
                          *)&this->visited_,&local_b0);
      functions._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)pVar4.first.super__Node_iterator_base<kratos::IRNode_*,_false>._M_cur;
      peVar2 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_98);
      (*this->_vptr_IRVisitor[6])(this,peVar2);
    }
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_98);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pmVar3 = Generator::functions_abi_cxx11_((Generator *)stmts_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
         *)&__range1_1,pmVar3);
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                      *)&__range1_1);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
                   *)&__range1_1);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&iter), bVar1) {
    ptr_1 = (element_type *)
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>
            ::operator*(&__end1_1);
    local_140 = std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                           &(ptr_1->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln);
    local_130 = local_140;
    local_138._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::IRNode_*,_std::hash<kratos::IRNode_*>,_std::equal_to<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
         ::find(&this->visited_,(key_type *)&local_140);
    local_148._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::IRNode_*,_std::hash<kratos::IRNode_*>,_std::equal_to<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
         ::end(&this->visited_);
    bVar1 = std::__detail::operator==(&local_138,&local_148);
    if (bVar1) {
      std::
      unordered_set<kratos::IRNode*,std::hash<kratos::IRNode*>,std::equal_to<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
      ::emplace<kratos::FunctionStmtBlock*&>
                ((unordered_set<kratos::IRNode*,std::hash<kratos::IRNode*>,std::equal_to<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
                  *)&this->visited_,&local_130);
      (**this->_vptr_IRVisitor)(this,local_130);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>
    ::operator++(&__end1_1);
  }
  this->level = this->level - 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
          *)&__range1_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return;
}

Assistant:

void IRVisitor::visit_content(Generator *generator) {
    generator->accept_generator(this);
    level++;
    uint64_t stmts_count = generator->stmts_count();
    for (uint64_t i = 0; i < stmts_count; i++) {
        auto *child = generator->get_child(i);
        if (visited_.find(child) == visited_.end()) {
            visited_.emplace(child);
            visit_root(child);
        }
    }
    // visit the vars
    auto var_names = generator->get_all_var_names();
    for (auto const &name : var_names) {
        auto var = generator->get_var(name);
        auto *ptr = var.get();
        if (visited_.find(ptr) == visited_.end()) {
            visited_.emplace(ptr);
            visit(var.get());
        }
    }
    // visit the functions
    // TODO: refactor this
    auto functions = generator->functions();
    for (auto const &iter : functions) {
        auto *ptr = iter.second.get();
        if (visited_.find(ptr) == visited_.end()) {
            visited_.emplace(ptr);
            visit_root(ptr);
        }
    }

    level--;
}